

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O3

void __thiscall TPZPolynomial::TPZPolynomial(TPZPolynomial *this,TPZVec<double> *coef,REAL *tol)

{
  (this->fCo)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fCo).fStore = (double *)0x0;
  (this->fCo).fNElements = 0;
  (this->fCo).fNAlloc = 0;
  TPZVec<double>::TPZVec(&this->fReal,3);
  this->fImagem = 0.0;
  this->fTolerance = *tol;
  SetCoef(this,coef);
  return;
}

Assistant:

TPZPolynomial::TPZPolynomial(const TPZVec<REAL> &coef, const REAL &tol): fReal(3), fImagem(0.0) {
    SetTolerance(tol);
    SetCoef(coef);
}